

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::~TextureSizeCase(TextureSizeCase *this)

{
  pointer pVVar1;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureSizeCase_021ac038;
  deinit(this);
  pVVar1 = (this->m_iterations).
           super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_iterations).
                                 super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

TextureSizeCase::~TextureSizeCase (void)
{
	deinit();
}